

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_0::AsyncStreamFd::tryPumpFrom
          (AsyncStreamFd *this,AsyncInputStream *input,uint64_t amount)

{
  ReadableFile *pRVar1;
  NullableValue<int> *other;
  int *piVar2;
  AsyncStreamFd *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  Maybe<kj::Promise<unsigned_long>_> MVar4;
  undefined1 local_88 [16];
  int *fd;
  NullableValue<int> local_60;
  NullableValue<int> _fd252;
  FileInputStream *file;
  NullableValue<int> local_48;
  FileInputStream *_file251;
  AsyncStreamFd *sock;
  AsyncStreamFd *local_30;
  AsyncStreamFd *_sock245;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  AsyncStreamFd *this_local;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar3;
  
  _sock245 = in_RCX;
  amount_local = amount;
  input_local = input;
  this_local = this;
  dynamicDowncastIfAvailable<kj::(anonymous_namespace)::AsyncStreamFd,kj::AsyncInputStream>
            ((kj *)&sock,(AsyncInputStream *)amount);
  _file251 = (FileInputStream *)
             kj::_::readMaybe<kj::(anonymous_namespace)::AsyncStreamFd>
                       ((Maybe<kj::(anonymous_namespace)::AsyncStreamFd_&> *)&sock);
  local_30 = (AsyncStreamFd *)_file251;
  if ((AsyncStreamFd *)_file251 == (AsyncStreamFd *)0x0) {
    dynamicDowncastIfAvailable<kj::FileInputStream,kj::AsyncInputStream>
              ((kj *)&file,(AsyncInputStream *)amount_local);
    local_48 = (NullableValue<int>)
               kj::_::readMaybe<kj::FileInputStream>((Maybe<kj::FileInputStream_&> *)&file);
    if (local_48 != (NullableValue<int>)0x0) {
      _fd252 = local_48;
      pRVar1 = FileInputStream::getUnderlyingFile((FileInputStream *)local_48);
      (**(pRVar1->super_FsNode)._vptr_FsNode)();
      other = kj::_::readMaybe<int>((Maybe<int> *)&stack0xffffffffffffff98);
      kj::_::NullableValue<int>::NullableValue(&local_60,other);
      Maybe<int>::~Maybe((Maybe<int> *)&stack0xffffffffffffff98);
      piVar2 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_60);
      if (piVar2 != (int *)0x0) {
        local_88._8_8_ = kj::_::NullableValue<int>::operator*(&local_60);
        pumpFromFile((AsyncStreamFd *)local_88,(FileInputStream *)input,_fd252._0_4_,
                     (ulong)*(uint *)local_88._8_8_,(uint64_t)_sock245);
        Maybe<kj::Promise<unsigned_long>_>::Maybe
                  ((Maybe<kj::Promise<unsigned_long>_> *)this,(Promise<unsigned_long> *)local_88);
        Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_88);
      }
      kj::_::NullableValue<int>::~NullableValue(&local_60);
      aVar3 = extraout_RDX;
      if (piVar2 != (int *)0x0) goto LAB_00902dd2;
    }
    Maybe<kj::Promise<unsigned_long>_>::Maybe((Maybe<kj::Promise<unsigned_long>_> *)this);
    aVar3 = extraout_RDX_00;
  }
  else {
    MVar4 = pumpFromOther(this,(AsyncStreamFd *)input,(uint64_t)_file251);
    aVar3 = MVar4.ptr.field_1;
  }
LAB_00902dd2:
  MVar4.ptr.field_1 = aVar3;
  MVar4.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar4.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
#if __linux__ && !__ANDROID__
    KJ_IF_SOME(sock, kj::dynamicDowncastIfAvailable<AsyncStreamFd>(input)) {
      return pumpFromOther(sock, amount);
    }
#endif

#if __linux__
    KJ_IF_SOME(file, kj::dynamicDowncastIfAvailable<FileInputStream>(input)) {
      KJ_IF_SOME(fd, file.getUnderlyingFile().getFd()) {
        return pumpFromFile(file, fd, amount, 0);
      }
    }
#endif

    return kj::none;
  }